

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprToRegister(Expr *pExpr,int iReg)

{
  byte *pbVar1;
  ExprList_item *pEVar2;
  
  while ((pExpr != (Expr *)0x0 && ((pExpr->flags & 0x82000) != 0))) {
    if ((pExpr->flags >> 0x13 & 1) == 0) {
      if (pExpr->op != 'r') break;
      pEVar2 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar2 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar2->pExpr;
  }
  if ((pExpr != (Expr *)0x0) && (pExpr->op != 0xb0)) {
    pExpr->op2 = pExpr->op;
    pExpr->op = 0xb0;
    pExpr->iTable = iReg;
    pbVar1 = (byte *)((long)&pExpr->flags + 1);
    *pbVar1 = *pbVar1 & 0xdf;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprToRegister(Expr *pExpr, int iReg){
  Expr *p = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( NEVER(p==0) ) return;
  if( p->op==TK_REGISTER ){
    assert( p->iTable==iReg );
  }else{
    p->op2 = p->op;
    p->op = TK_REGISTER;
    p->iTable = iReg;
    ExprClearProperty(p, EP_Skip);
  }
}